

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalinterrupt.cpp
# Opt level: O2

bool __thiscall util::SignalInterrupt::reset(SignalInterrupt *this)

{
  long lVar1;
  bool bVar2;
  __pid_t _Var3;
  void *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_flag)._M_base._M_i & 1U) != 0) {
    _Var3 = wait(this,in_RSI);
    if ((char)_Var3 == '\0') {
      bVar2 = false;
      goto LAB_006209c8;
    }
  }
  LOCK();
  (this->m_flag)._M_base._M_i = false;
  UNLOCK();
  bVar2 = true;
LAB_006209c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SignalInterrupt::reset()
{
    // Cancel existing interrupt by waiting for it, this will reset condition flags and remove
    // the token from the pipe.
    if (*this && !wait()) return false;
    m_flag = false;
    return true;
}